

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O0

void arg_dump_r(cmd_ln_t *cmdln,FILE *fp,arg_t *defn,int32 doc)

{
  void *pvVar1;
  anytype_t *paVar2;
  char *pcVar3;
  char **array;
  anytype_t *vp;
  int32 deflen;
  int32 namelen;
  size_t l;
  int32 n;
  int32 i;
  arg_t **pos;
  arg_t *paStack_20;
  int32 doc_local;
  arg_t *defn_local;
  FILE *fp_local;
  cmd_ln_t *cmdln_local;
  
  if ((defn != (arg_t *)0x0) && (fp != (FILE *)0x0)) {
    pos._4_4_ = doc;
    paStack_20 = defn;
    defn_local = (arg_t *)fp;
    fp_local = (FILE *)cmdln;
    l._0_4_ = arg_strlen(defn,(int32 *)((long)&vp + 4),(int32 *)&vp);
    vp._4_4_ = vp._4_4_ & 0xfffffff8;
    vp._0_4_ = (uint)vp & 0xfffffff8;
    fprintf((FILE *)defn_local,"[NAME]");
    for (_deflen = 6; _deflen < (ulong)(long)(int)vp._4_4_; _deflen = _deflen + 8) {
      fprintf((FILE *)defn_local,"\t");
    }
    fprintf((FILE *)defn_local,"\t[DEFLT]");
    for (_deflen = 7; _deflen < (ulong)(long)(int)(uint)vp; _deflen = _deflen + 8) {
      fprintf((FILE *)defn_local,"\t");
    }
    if (pos._4_4_ == 0) {
      fprintf((FILE *)defn_local,"\t[VALUE]\n");
    }
    else {
      fprintf((FILE *)defn_local,"\t[DESCR]\n");
    }
    _n = arg_sort(paStack_20,(int32)l);
    for (l._4_4_ = 0; l._4_4_ < (int32)l; l._4_4_ = l._4_4_ + 1) {
      fprintf((FILE *)defn_local,"%s",_n[l._4_4_]->name);
      for (_deflen = strlen(_n[l._4_4_]->name); _deflen < (ulong)(long)(int)vp._4_4_;
          _deflen = _deflen + 8) {
        fprintf((FILE *)defn_local,"\t");
      }
      fprintf((FILE *)defn_local,"\t");
      if (_n[l._4_4_]->deflt == (char *)0x0) {
        _deflen = 0;
      }
      else {
        fprintf((FILE *)defn_local,"%s",_n[l._4_4_]->deflt);
        _deflen = strlen(_n[l._4_4_]->deflt);
      }
      for (; _deflen < (ulong)(long)(int)(uint)vp; _deflen = _deflen + 8) {
        fprintf((FILE *)defn_local,"\t");
      }
      fprintf((FILE *)defn_local,"\t");
      if (pos._4_4_ == 0) {
        paVar2 = cmd_ln_access_r((cmd_ln_t *)fp_local,_n[l._4_4_]->name);
        if (paVar2 != (anytype_t *)0x0) {
          switch(_n[l._4_4_]->type) {
          case 2:
          case 3:
            fprintf((FILE *)defn_local,"%ld",paVar2->ptr);
            break;
          case 4:
          case 5:
            fprintf((FILE *)defn_local,"%e",paVar2->ptr);
            break;
          default:
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                    ,0x146,"Unknown argument type: %d\n",(ulong)(uint)_n[l._4_4_]->type);
            break;
          case 8:
          case 9:
            if (paVar2->ptr != (void *)0x0) {
              fprintf((FILE *)defn_local,"%s",paVar2->ptr);
            }
            break;
          case 0x10:
          case 0x11:
            pcVar3 = "no";
            if (paVar2->ptr != (void *)0x0) {
              pcVar3 = "yes";
            }
            fprintf((FILE *)defn_local,"%s",pcVar3);
            break;
          case 0x20:
            pvVar1 = paVar2->ptr;
            if (pvVar1 != (void *)0x0) {
              for (_deflen = 0; *(long *)((long)pvVar1 + _deflen * 8) != 0; _deflen = _deflen + 1) {
                fprintf((FILE *)defn_local,"%s,",*(undefined8 *)((long)pvVar1 + _deflen * 8));
              }
            }
          }
        }
      }
      else if (_n[l._4_4_]->doc != (char *)0x0) {
        fprintf((FILE *)defn_local,"%s",_n[l._4_4_]->doc);
      }
      fprintf((FILE *)defn_local,"\n");
    }
    ckd_free(_n);
    fprintf((FILE *)defn_local,"\n");
  }
  return;
}

Assistant:

static void
arg_dump_r(cmd_ln_t *cmdln, FILE *fp, const arg_t * defn, int32 doc)
{
    arg_t const **pos;
    int32 i, n;
    size_t l;
    int32 namelen, deflen;
    anytype_t *vp;
    char const **array;

    /* No definitions, do nothing. */
    if (defn == NULL || fp == NULL)
        return;

    /* Find max lengths of name and default value fields, and #entries in defn */
    n = arg_strlen(defn, &namelen, &deflen);
    /*    E_INFO("String length %d. Name length %d, Default Length %d\n",n, namelen, deflen); */
    namelen = namelen & 0xfffffff8;     /* Previous tab position */
    deflen = deflen & 0xfffffff8;       /* Previous tab position */

    fprintf(fp, "[NAME]");
    for (l = strlen("[NAME]"); l < namelen; l += 8)
        fprintf(fp, "\t");
    fprintf(fp, "\t[DEFLT]");
    for (l = strlen("[DEFLT]"); l < deflen; l += 8)
        fprintf(fp, "\t");

    if (doc) {
        fprintf(fp, "\t[DESCR]\n");
    }
    else {
        fprintf(fp, "\t[VALUE]\n");
    }

    /* Print current configuration, sorted by name */
    pos = arg_sort(defn, n);
    for (i = 0; i < n; i++) {
        fprintf(fp, "%s", pos[i]->name);
        for (l = strlen(pos[i]->name); l < namelen; l += 8)
            fprintf(fp, "\t");

        fprintf(fp, "\t");
        if (pos[i]->deflt) {
            fprintf(fp, "%s", pos[i]->deflt);
            l = strlen(pos[i]->deflt);
        }
        else
            l = 0;
        for (; l < deflen; l += 8)
            fprintf(fp, "\t");

        fprintf(fp, "\t");
        if (doc) {
            if (pos[i]->doc)
                fprintf(fp, "%s", pos[i]->doc);
        }
        else {
            vp = cmd_ln_access_r(cmdln, pos[i]->name);
            if (vp) {
                switch (pos[i]->type) {
                case ARG_INTEGER:
                case REQARG_INTEGER:
                    fprintf(fp, "%ld", vp->i);
                    break;
                case ARG_FLOATING:
                case REQARG_FLOATING:
                    fprintf(fp, "%e", vp->fl);
                    break;
                case ARG_STRING:
                case REQARG_STRING:
                    if (vp->ptr)
                        fprintf(fp, "%s", (char *)vp->ptr);
                    break;
                case ARG_STRING_LIST:
                    array = (char const**)vp->ptr;
                    if (array)
                        for (l = 0; array[l] != 0; l++) {
                            fprintf(fp, "%s,", array[l]);
                        }
                    break;
                case ARG_BOOLEAN:
                case REQARG_BOOLEAN:
                    fprintf(fp, "%s", vp->i ? "yes" : "no");
                    break;
                default:
                    E_ERROR("Unknown argument type: %d\n", pos[i]->type);
                }
            }
        }

        fprintf(fp, "\n");
    }
    ckd_free(pos);

    fprintf(fp, "\n");
}